

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general.c
# Opt level: O2

axbStatus_t axbMemBackendGetByName(axbHandle_s *handle,axbMemBackend_s **mem,char *name)

{
  size_t sVar1;
  axbMemBackend_s *paVar2;
  int iVar3;
  size_t i;
  size_t sVar4;
  
  *mem = (axbMemBackend_s *)0x0;
  sVar1 = handle->memBackends_size;
  sVar4 = 0;
  do {
    if (sVar1 == sVar4) {
      return 0;
    }
    paVar2 = handle->memBackends[sVar4];
    iVar3 = strcmp(paVar2->name,name);
    sVar4 = sVar4 + 1;
  } while (iVar3 != 0);
  *mem = paVar2;
  return 0;
}

Assistant:

axbStatus_t axbMemBackendGetByName(struct axbHandle_s *handle, struct axbMemBackend_s **mem, const char *name)
{
  *mem = NULL;
  for (size_t i=0; i<handle->memBackends_size; ++i){
    if ( strcmp(handle->memBackends[i]->name, name) == 0) {
      *mem = handle->memBackends[i];
      return 0;
    }
  }
  return 0;
}